

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O3

optional<QHttpHeaders::WellKnownHeader> __thiscall
HeaderName::toWellKnownHeader(HeaderName *this,QByteArrayView name)

{
  byte bVar1;
  uint uVar2;
  HeaderName *pHVar3;
  int iVar4;
  HeaderName *pHVar5;
  ulong uVar6;
  quint8 *pqVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  View VVar11;
  
  pqVar7 = "";
  uVar6 = 0xb1;
  do {
    uVar8 = uVar6 >> 1;
    VVar11 = QOffsetStringArray<std::array<char,_2515UL>,_std::array<unsigned_short,_178UL>_>::
             viewAt(&headerNames,(ulong)pqVar7[uVar8]);
    pHVar5 = (HeaderName *)VVar11.m_size;
    lVar9 = (long)pHVar5 - (long)this;
    if (this <= pHVar5) {
      pHVar5 = this;
    }
    if (pHVar5 == (HeaderName *)0x0) {
LAB_0018ff62:
      if (lVar9 < -0x7fffffff) {
        lVar9 = -0x80000000;
      }
      if (0x7ffffffe < lVar9) {
        lVar9 = 0x7fffffff;
      }
      iVar4 = (int)lVar9;
    }
    else {
      iVar4 = memcmp(VVar11.m_data,(void *)name.m_size,(size_t)pHVar5);
      if (iVar4 == 0) goto LAB_0018ff62;
    }
    if (iVar4 < 0) {
      pqVar7 = pqVar7 + uVar8 + 1;
      uVar8 = ~uVar8 + uVar6;
    }
    uVar6 = uVar8;
  } while (0 < (long)uVar8);
  if (pqVar7 != (quint8 *)"QHttpHeaders(") {
    bVar1 = *pqVar7;
    uVar8 = (ulong)bVar1;
    uVar2 = 0xb1;
    if (bVar1 < 0xb1) {
      uVar2 = (uint)bVar1;
    }
    uVar6 = (ulong)headerNames.m_offsets._M_elems[uVar2];
    pHVar5 = (HeaderName *)0xffffffffffffffff;
    do {
      pHVar3 = pHVar5 + 0x12d66;
      pHVar5 = (HeaderName *)
               ((long)&(pHVar5->data).super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>
                       .super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 1);
    } while (*(char *)((long)&(pHVar3->data).
                              super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                      + uVar6 + 1) != '\0');
    if (this == pHVar5) {
      uVar10 = 0x100000000;
      if (this == (HeaderName *)0x0) goto LAB_00190002;
      iVar4 = bcmp((void *)name.m_size,headerNames.m_string._M_elems + uVar6,(size_t)this);
      if (iVar4 == 0) goto LAB_00190002;
    }
  }
  uVar10 = 0;
LAB_00190002:
  return (optional<QHttpHeaders::WellKnownHeader>)(uVar8 & 0xffffffff | uVar10);
}

Assistant:

static std::optional<QHttpHeaders::WellKnownHeader> toWellKnownHeader(QByteArrayView name) noexcept
    {
        auto indexesBegin = std::cbegin(orderedHeaderNameIndexes);
        auto indexesEnd = std::cend(orderedHeaderNameIndexes);

        auto result = std::lower_bound(indexesBegin, indexesEnd, name, ByIndirectHeaderName{});

        if (result != indexesEnd && name == headerNames[*result])
            return static_cast<QHttpHeaders::WellKnownHeader>(*result);
        return std::nullopt;
    }